

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

void __thiscall pbrt::ShapeSceneEntity::~ShapeSceneEntity(ShapeSceneEntity *this)

{
  SceneEntity *in_RDI;
  
  std::__cxx11::string::~string((string *)((long)&in_RDI[1].parameters.params.field_2 + 0x30));
  std::__cxx11::string::~string((string *)((long)&in_RDI[1].parameters.params.field_2 + 0x10));
  std::__cxx11::string::~string((string *)(in_RDI[1].name.field_2._M_local_buf + 8));
  SceneEntity::~SceneEntity(in_RDI);
  return;
}

Assistant:

ShapeSceneEntity(const std::string &name, ParameterDictionary parameters, FileLoc loc,
                     const Transform *renderFromObject, const Transform *objectFromRender,
                     bool reverseOrientation, int materialIndex,
                     const std::string &materialName, int lightIndex,
                     const std::string &insideMedium, const std::string &outsideMedium)
        : SceneEntity(name, parameters, loc),
          renderFromObject(renderFromObject),
          objectFromRender(objectFromRender),
          reverseOrientation(reverseOrientation),
          materialIndex(materialIndex),
          materialName(materialName),
          lightIndex(lightIndex),
          insideMedium(insideMedium),
          outsideMedium(outsideMedium) {}